

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

void Abc_SclApplyUpdateToBest(Vec_Int_t *vGatesBest,Vec_Int_t *vGates,Vec_Int_t *vUpdate)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  for (iVar3 = 1; iVar3 < vUpdate->nSize; iVar3 = iVar3 + 2) {
    iVar1 = Vec_IntEntry(vUpdate,iVar3 + -1);
    iVar2 = Vec_IntEntry(vUpdate,iVar3);
    Vec_IntWriteEntry(vGatesBest,iVar1,iVar2);
  }
  vUpdate->nSize = 0;
  iVar3 = 0;
  do {
    if (vGatesBest->nSize <= iVar3) {
      return;
    }
    iVar1 = Vec_IntEntry(vGatesBest,iVar3);
    iVar2 = Vec_IntEntry(vGates,iVar3);
    iVar3 = iVar3 + 1;
  } while (iVar1 == iVar2);
  __assert_fail("GateId == GateId2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                ,0x2cc,"void Abc_SclApplyUpdateToBest(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Abc_SclApplyUpdateToBest( Vec_Int_t * vGatesBest, Vec_Int_t * vGates, Vec_Int_t * vUpdate )
{
    int i, ObjId, GateId, GateId2; 
    Vec_IntForEachEntryDouble( vUpdate, ObjId, GateId, i )
        Vec_IntWriteEntry( vGatesBest, ObjId, GateId );
    Vec_IntClear( vUpdate );
    Vec_IntForEachEntryTwo( vGatesBest, vGates, GateId, GateId2, i )
        assert( GateId == GateId2 );
//    Vec_IntClear( vGatesBest );
//    Vec_IntAppend( vGatesBest, vGates );
}